

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void rtc::LogMultiline(LoggingSeverity level,char *label,bool input,void *data,size_t len,
                      bool hex_mode,LogMultilineState *state)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  byte *pbVar7;
  long lVar8;
  char *pcVar9;
  byte *pbVar10;
  size_t i;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  byte *pbVar14;
  char *in_stack_fffffffffffffd78;
  char asc_line [25];
  char hex_line [56];
  LogMessage local_1f0;
  
  if (LogMessage::min_sev_ <= (int)level) {
    pcVar9 = " >> ";
    if (input) {
      pcVar9 = " << ";
    }
    uVar13 = (ulong)input;
    if (data == (void *)0x0) {
      if ((state != (LogMultilineState *)0x0) && (*(long *)(state + uVar13 * 8) != 0)) {
        LogMessage::LogMessage
                  (&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                   ,0x1c2,level,ERRCTX_NONE,0,in_stack_fffffffffffffd78);
        poVar6 = std::operator<<((ostream *)&local_1f0,label);
        poVar6 = std::operator<<(poVar6,pcVar9);
        poVar6 = std::operator<<(poVar6,"## ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::operator<<(poVar6," consecutive unprintable ##");
        LogMessage::~LogMessage(&local_1f0);
        *(undefined8 *)(state + uVar13 * 8) = 0;
      }
    }
    else if (hex_mode) {
      for (; len != 0; len = len - uVar13) {
        builtin_strncpy(asc_line + 0x10,"         ",9);
        builtin_strncpy(asc_line,"                ",0x10);
        builtin_strncpy(hex_line,"                                                        ",0x38);
        uVar13 = 0x18;
        if (len < 0x18) {
          uVar13 = len;
        }
        for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          bVar3 = *(byte *)((long)data + uVar11);
          iVar5 = isprint((uint)bVar3);
          if (iVar5 == 0) {
            bVar3 = 0x2e;
          }
          asc_line[uVar11] = bVar3;
          cVar4 = hex_encode('\0');
          hex_line[uVar11 * 2 + (uVar11 >> 2)] = cVar4;
          cVar4 = hex_encode('\0');
          hex_line[uVar11 * 2 + (uVar11 >> 2) + 1] = cVar4;
        }
        asc_line._17_8_ = asc_line._17_8_ & 0xffffffffffffff;
        hex_line._48_8_ = hex_line._48_8_ & 0xffffffffffffff;
        if (LogMessage::min_sev_ <= (int)level) {
          LogMessage::LogMessage
                    (&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                     ,0x1dc,level,ERRCTX_NONE,0,in_stack_fffffffffffffd78);
          poVar6 = std::operator<<((ostream *)&local_1f0,label);
          poVar6 = std::operator<<(poVar6,pcVar9);
          poVar6 = std::operator<<(poVar6,asc_line);
          poVar6 = std::operator<<(poVar6," ");
          poVar6 = std::operator<<(poVar6,hex_line);
          std::operator<<(poVar6," ");
          LogMessage::~LogMessage(&local_1f0);
        }
        data = (void *)((long)data + uVar13);
      }
    }
    else {
      if (state == (LogMultilineState *)0x0) {
        pbVar14 = (byte *)0x0;
      }
      else {
        pbVar14 = *(byte **)(state + uVar13 * 8);
      }
      pbVar10 = (byte *)(len + (long)data);
      while (data < pbVar10) {
        pbVar7 = strchrn<unsigned_char>((uchar *)data,(long)pbVar10 - (long)data,'\n');
        pbVar1 = pbVar7 + 1;
        if (pbVar7 == (byte *)0x0) {
          pbVar7 = pbVar10;
          pbVar1 = pbVar10;
        }
        if ((pbVar14 == (byte *)0x0) || (3 < (long)pbVar7 - (long)data)) {
          bVar2 = true;
          for (pbVar12 = (byte *)data; pbVar12 < pbVar7; pbVar12 = pbVar12 + 1) {
            bVar3 = *pbVar12;
            iVar5 = isspace((uint)bVar3);
            if (iVar5 == 0) {
              iVar5 = isprint((uint)bVar3);
              bVar2 = false;
              if (iVar5 == 0) goto LAB_00146985;
            }
          }
          bVar2 = (bool)(bVar2 ^ 1);
LAB_00146985:
          if (pbVar14 == (byte *)0x0) {
            bVar2 = pbVar7 <= pbVar12;
          }
          if (!bVar2) goto LAB_00146b0a;
          pbVar12 = pbVar7;
          if ((pbVar14 != (byte *)0x0) && (LogMessage::min_sev_ <= (int)level)) {
            LogMessage::LogMessage
                      (&local_1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                       ,0x212,level,ERRCTX_NONE,0,in_stack_fffffffffffffd78);
            poVar6 = std::operator<<((ostream *)&local_1f0,label);
            poVar6 = std::operator<<(poVar6,pcVar9);
            poVar6 = std::operator<<(poVar6,"## ");
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::operator<<(poVar6," consecutive unprintable ##");
            LogMessage::~LogMessage(&local_1f0);
          }
          do {
            pbVar14 = pbVar12;
            if (pbVar7 <= data) break;
            pbVar12 = pbVar7 + -1;
            pbVar7 = pbVar7 + -1;
            iVar5 = isspace((uint)*pbVar12);
            pbVar12 = pbVar14 + -1;
          } while (iVar5 != 0);
          hex_line._0_8_ = hex_line + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)hex_line,data,pbVar14);
          lVar8 = std::__cxx11::string::find(hex_line,0x199c1b);
          if ((lVar8 == -1) && (lVar8 = std::__cxx11::string::find(hex_line,0x199c21), lVar8 == -1))
          {
            if (LogMessage::min_sev_ <= (int)level) {
              LogMessage::LogMessage
                        (&local_1f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                         ,0x221,level,ERRCTX_NONE,0,in_stack_fffffffffffffd78);
              poVar6 = std::operator<<((ostream *)&local_1f0,label);
              poVar6 = std::operator<<(poVar6,pcVar9);
              std::operator<<(poVar6,(string *)hex_line);
LAB_00146aed:
              LogMessage::~LogMessage(&local_1f0);
            }
          }
          else if (LogMessage::min_sev_ <= (int)level) {
            LogMessage::LogMessage
                      (&local_1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                       ,0x223,level,ERRCTX_NONE,0,in_stack_fffffffffffffd78);
            poVar6 = std::operator<<((ostream *)&local_1f0,label);
            poVar6 = std::operator<<(poVar6,pcVar9);
            std::operator<<(poVar6,"## omitted for privacy ##");
            goto LAB_00146aed;
          }
          std::__cxx11::string::~string((string *)hex_line);
          pbVar14 = (byte *)0x0;
          data = pbVar1;
        }
        else {
LAB_00146b0a:
          pbVar14 = pbVar1 + ((long)pbVar14 - (long)data);
          data = pbVar1;
        }
      }
      if (state != (LogMultilineState *)0x0) {
        *(byte **)(state + uVar13 * 8) = pbVar14;
      }
    }
  }
  return;
}

Assistant:

void LogMultiline(LoggingSeverity level, const char* label, bool input,
                  const void* data, size_t len, bool hex_mode,
                  LogMultilineState* state) {
  if (!LOG_CHECK_LEVEL_V(level))
    return;

  const char * direction = (input ? " << " : " >> ");

  // NULL data means to flush our count of unprintable characters.
  if (!data) {
    if (state && state->unprintable_count_[input]) {
      LOG_V(level) << label << direction << "## "
                   << state->unprintable_count_[input]
                   << " consecutive unprintable ##";
      state->unprintable_count_[input] = 0;
    }
    return;
  }

  // The ctype classification functions want unsigned chars.
  const unsigned char* udata = static_cast<const unsigned char*>(data);

  if (hex_mode) {
    const size_t LINE_SIZE = 24;
    char hex_line[LINE_SIZE * 9 / 4 + 2], asc_line[LINE_SIZE + 1];
    while (len > 0) {
      memset(asc_line, ' ', sizeof(asc_line));
      memset(hex_line, ' ', sizeof(hex_line));
      size_t line_len = std::min(len, LINE_SIZE);
      for (size_t i = 0; i < line_len; ++i) {
        unsigned char ch = udata[i];
        asc_line[i] = isprint(ch) ? ch : '.';
        hex_line[i*2 + i/4] = hex_encode(ch >> 4);
        hex_line[i*2 + i/4 + 1] = hex_encode(ch & 0xf);
      }
      asc_line[sizeof(asc_line)-1] = 0;
      hex_line[sizeof(hex_line)-1] = 0;
      LOG_V(level) << label << direction
                   << asc_line << " " << hex_line << " ";
      udata += line_len;
      len -= line_len;
    }
    return;
  }

  size_t consecutive_unprintable = state ? state->unprintable_count_[input] : 0;

  const unsigned char* end = udata + len;
  while (udata < end) {
    const unsigned char* line = udata;
    const unsigned char* end_of_line = strchrn<unsigned char>(udata,
                                                              end - udata,
                                                              '\n');
    if (!end_of_line) {
      udata = end_of_line = end;
    } else {
      udata = end_of_line + 1;
    }

    bool is_printable = true;

    // If we are in unprintable mode, we need to see a line of at least
    // kMinPrintableLine characters before we'll switch back.
    const ptrdiff_t kMinPrintableLine = 4;
    if (consecutive_unprintable && ((end_of_line - line) < kMinPrintableLine)) {
      is_printable = false;
    } else {
      // Determine if the line contains only whitespace and printable
      // characters.
      bool is_entirely_whitespace = true;
      for (const unsigned char* pos = line; pos < end_of_line; ++pos) {
        if (isspace(*pos))
          continue;
        is_entirely_whitespace = false;
        if (!isprint(*pos)) {
          is_printable = false;
          break;
        }
      }
      // Treat an empty line following unprintable data as unprintable.
      if (consecutive_unprintable && is_entirely_whitespace) {
        is_printable = false;
      }
    }
    if (!is_printable) {
      consecutive_unprintable += (udata - line);
      continue;
    }
    // Print out the current line, but prefix with a count of prior unprintable
    // characters.
    if (consecutive_unprintable) {
      LOG_V(level) << label << direction << "## " << consecutive_unprintable
                  << " consecutive unprintable ##";
      consecutive_unprintable = 0;
    }
    // Strip off trailing whitespace.
    while ((end_of_line > line) && isspace(*(end_of_line-1))) {
      --end_of_line;
    }
    // Filter out any private data
    std::string substr(reinterpret_cast<const char*>(line), end_of_line - line);
    std::string::size_type pos_private = substr.find("Email");
    if (pos_private == std::string::npos) {
      pos_private = substr.find("Passwd");
    }
    if (pos_private == std::string::npos) {
      LOG_V(level) << label << direction << substr;
    } else {
      LOG_V(level) << label << direction << "## omitted for privacy ##";
    }
  }

  if (state) {
    state->unprintable_count_[input] = consecutive_unprintable;
  }
}